

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O3

bool dxil_spv::extract_raw_buffer_access_split
               (Value *index,uint stride,uint32_t addr_shift_log2,uint vecsize,
               RawBufferAccessSplit *split)

{
  byte bVar1;
  bool bVar2;
  ValueKind VVar3;
  BinaryOps BVar4;
  Constant *pCVar5;
  APInt *pAVar6;
  int64_t iVar7;
  Value *pVVar8;
  BinaryOperator *this;
  Value *value;
  Constant *this_00;
  uint64_t uVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  uint64_t uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  char local_1038 [4104];
  
  bVar1 = (byte)addr_shift_log2 & 0x1f;
  uVar16 = vecsize << bVar1;
  if (index != (Value *)0x0) {
    pCVar5 = (Constant *)LLVMBC::Internal::resolve_proxy(index);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar5);
    if (VVar3 == ConstantInt) {
      pAVar6 = LLVMBC::Constant::getUniqueInteger(pCVar5);
      iVar7 = LLVMBC::APInt::getSExtValue(pAVar6);
      if ((vecsize != 1) && ((long)((ulong)stride * iVar7) % (long)(int)uVar16 != 0)) {
        return false;
      }
      split->scale = 0;
      split->bias = 0;
      split->dynamic_index = (Value *)0x0;
      split->bias = (long)((ulong)stride * iVar7) / (long)(ulong)uVar16;
      return true;
    }
  }
  pCVar5 = (Constant *)0x0;
  bVar2 = false;
  uVar17 = 0 << bVar1;
  bVar19 = false;
  do {
    pVVar8 = LLVMBC::Internal::resolve_proxy(index);
    VVar3 = LLVMBC::Value::get_value_kind(pVVar8);
    if (VVar3 != BinaryOperator) goto LAB_0014d190;
    this = (BinaryOperator *)LLVMBC::Internal::resolve_proxy(index);
    VVar3 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar3 != BinaryOperator) {
      p_Var10 = get_thread_log_callback();
      if (p_Var10 != (LoggingCallback)0x0) {
        builtin_strncpy(local_1038 + 0x10,"in cast<T>.\n",0xd);
        builtin_strncpy(local_1038,"Invalid type ID ",0x10);
        pvVar11 = get_thread_log_callback_userdata();
        (*p_Var10)(pvVar11,Error,local_1038);
        std::terminate();
      }
      extract_raw_buffer_access_split();
      std::terminate();
    }
    value = LLVMBC::Instruction::getOperand((Instruction *)this,0);
    pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)this,1);
    if ((pCVar5 == (Constant *)0x0) &&
       ((((BVar4 = LLVMBC::BinaryOperator::getOpcode(this), BVar4 == Add ||
          (BVar4 = LLVMBC::BinaryOperator::getOpcode(this), BVar4 == Sub)) ||
         (BVar4 = LLVMBC::BinaryOperator::getOpcode(this), BVar4 == Or)) ||
        (BVar4 = LLVMBC::BinaryOperator::getOpcode(this), BVar4 == Xor)))) {
      if (value == (Value *)0x0) {
LAB_0014d096:
        if (pVVar8 == (Value *)0x0) {
LAB_0014d1da:
          if (stride % uVar16 == 0) {
            split->bias = 0;
            split->scale = (ulong)stride / (ulong)uVar16;
            split->dynamic_index = index;
            return true;
          }
          return false;
        }
        pCVar5 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar8);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar5);
        pVVar8 = value;
        if (VVar3 != ConstantInt) goto LAB_0014d1da;
      }
      else {
        pCVar5 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)pCVar5);
        if (VVar3 != ConstantInt) goto LAB_0014d096;
      }
      BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
      bVar19 = BVar4 == Sub;
      BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
      uVar17 = (uint)(BVar4 == Add || bVar19);
      this_00 = (Constant *)0x0;
      value = pVVar8;
    }
    else {
      BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
      if (BVar4 != Shl) {
        BVar4 = LLVMBC::BinaryOperator::getOpcode(this);
        if (BVar4 == Mul) {
          if (value != (Value *)0x0) {
            this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(value);
            VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
            if (VVar3 == ConstantInt) {
              bVar2 = false;
              value = pVVar8;
              goto LAB_0014d151;
            }
          }
          if (pVVar8 != (Value *)0x0) {
            this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar8);
            VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
            if (VVar3 == ConstantInt) {
              bVar2 = false;
              goto LAB_0014d151;
            }
          }
        }
LAB_0014d190:
        if (pCVar5 == (Constant *)0x0) goto LAB_0014d1da;
        uVar14 = (ulong)bVar2 + 1;
        goto LAB_0014d1a0;
      }
      if (pVVar8 == (Value *)0x0) goto LAB_0014d190;
      this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar8);
      VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
      if (VVar3 != ConstantInt) goto LAB_0014d190;
      bVar2 = true;
    }
LAB_0014d151:
    index = value;
  } while (this_00 == (Constant *)0x0);
  pAVar6 = LLVMBC::Constant::getUniqueInteger(this_00);
  uVar9 = LLVMBC::APInt::getZExtValue(pAVar6);
  uVar14 = 1L << ((byte)uVar9 & 0x3f);
  if (!bVar2) {
    uVar14 = uVar9;
  }
  if (pCVar5 == (Constant *)0x0) {
    uVar15 = 0;
  }
  else {
LAB_0014d1a0:
    pAVar6 = LLVMBC::Constant::getUniqueInteger(pCVar5);
    uVar15 = LLVMBC::APInt::getSExtValue(pAVar6);
  }
  uVar12 = -uVar15;
  if (!bVar19) {
    uVar12 = uVar15;
  }
  if (((uVar17 & 1) == 0) && ((uVar12 & uVar14) != 0)) {
    return false;
  }
  uVar15 = uVar14 * stride;
  uVar18 = (ulong)uVar16;
  if (uVar15 % uVar18 != 0) {
    return false;
  }
  lVar13 = uVar12 * stride;
  if (lVar13 % (long)uVar18 == 0) {
    if (index != (Value *)0x0) {
      split->scale = uVar15 / uVar18;
      split->bias = lVar13 / (long)(int)uVar16;
      split->dynamic_index = index;
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool extract_raw_buffer_access_split(const llvm::Value *index, unsigned stride,
                                     uint32_t addr_shift_log2, unsigned vecsize,
                                     RawBufferAccessSplit &split)
{
	unsigned element_size = (1u << addr_shift_log2) * vecsize;

	// Base case first, a constant value.
	if (const auto *const_addr = llvm::dyn_cast<llvm::ConstantInt>(index))
	{
		int64_t constant_offset = const_addr->getUniqueInteger().getSExtValue();
		constant_offset *= stride;

		// Always pass scalar constant dividers through.
		// Building a fallback divider helps nothing.
		if (vecsize == 1 || constant_offset % int(element_size) == 0)
		{
			split = {};
			split.bias = constant_offset / element_size;
			return true;
		}
		else
			return false;
	}

	const llvm::ConstantInt *scale = nullptr;
	const llvm::ConstantInt *bias = nullptr;
	bool scale_log2 = false;
	bool bias_is_add = false;
	bool bias_negate = false;

	while (!scale && llvm::isa<llvm::BinaryOperator>(index))
	{
		auto *binop = llvm::cast<llvm::BinaryOperator>(index);
		auto *lhs = binop->getOperand(0);
		auto *rhs = binop->getOperand(1);
		if (!bias && (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Or ||
		              binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Xor))
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				bias = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				bias = const_rhs;
				index = lhs;
			}
			else
				break;

			// DXC tends to be emit shift + or in some cases.
			// We can turn this back into mul + add in most cases.
			bias_negate = binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Sub;
			bias_is_add =
					binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add ||
					bias_negate;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Shl)
		{
			if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = true;
		}
		else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Mul)
		{
			if (const auto *const_lhs = llvm::dyn_cast<llvm::ConstantInt>(lhs))
			{
				scale = const_lhs;
				index = rhs;
			}
			else if (const auto *const_rhs = llvm::dyn_cast<llvm::ConstantInt>(rhs))
			{
				scale = const_rhs;
				index = lhs;
			}
			else
				break;

			scale_log2 = false;
		}
		else
			break;
	}

	if (!scale && !bias)
	{
		// We cannot split anything, but we might be able to vectorize if the stride alone carries us.
		if (stride % element_size == 0)
		{
			split = {};
			split.scale = stride / element_size;
			split.dynamic_index = index;
			return true;
		}
		else
			return false;
	}

	uint64_t scale_factor = 1;
	if (scale)
		scale_factor = scale->getUniqueInteger().getZExtValue();
	if (scale_log2)
		scale_factor = 1ull << scale_factor;

	int64_t bias_factor = 0;
	if (bias)
		bias_factor = bias->getUniqueInteger().getSExtValue();
	if (bias_negate)
		bias_factor = -bias_factor;

	// If there is no bit overlap between scale_factor and bias_factor
	// then the bitwise OR is equivalent to add.
	if (!bias_is_add && (scale_factor & bias_factor) != 0)
		return false;

	scale_factor *= stride;
	bias_factor *= stride;

	if (scale_factor % element_size == 0 && bias_factor % element_size == 0 && index)
	{
		split.scale = scale_factor / element_size;
		split.bias = bias_factor / int(element_size);
		split.dynamic_index = index;
		return true;
	}
	else
		return false;
}